

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O2

void mg::data::mzp_write(Mzp *mzp,string *out)

{
  int iVar1;
  int iVar2;
  pointer pMVar3;
  pointer pbVar4;
  pointer pMVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 local_48 [8];
  vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  entry_headers;
  
  out->_M_string_length = 0;
  *(out->_M_dataplus)._M_p = '\0';
  iVar1 = *(int *)&(mzp->entry_headers).
                   super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(mzp->entry_headers).
                   super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::resize((ulong)out);
  *(ulong *)(out->_M_dataplus)._M_p = (ulong)(iVar1 - iVar2 & 0x7fff8) << 0x2d | 0x30306467726d;
  lVar10 = (long)(mzp->entry_headers).
                 super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(mzp->entry_headers).
                 super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
  vector((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_> *)
         local_48,&mzp->entry_headers);
  pMVar3 = (mzp->entry_headers).
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = (mzp->entry_data).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (mzp->entry_headers).
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < (ulong)((long)pMVar3 - (long)pMVar5 >> 3);
      uVar8 = uVar8 + 1) {
    uVar6 = pbVar4[uVar9]._M_string_length;
    ((pointer)((long)local_48 + uVar9 * 8))->sector_offset = (uint16_t)(uVar7 >> 0xb);
    ((pointer)((long)local_48 + uVar9 * 8))->byte_offset = (ushort)uVar7 & 0x7ff;
    ((pointer)((long)local_48 + uVar9 * 8))->size_sectors =
         ((short)(uVar6 >> 0xb) + 1) - (ushort)((uVar6 & 0x7ff) == 0);
    ((pointer)((long)local_48 + uVar9 * 8))->size_bytes = (uint16_t)uVar6;
    uVar7 = uVar7 + uVar6;
  }
  std::__cxx11::string::resize((ulong)out,(char)uVar7 + (char)lVar10 + '\b');
  for (uVar8 = 0; uVar7 = (ulong)uVar8,
      uVar7 < (ulong)((long)(mzp->entry_headers).
                            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(mzp->entry_headers).
                            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    *(MzpArchiveEntry *)((out->_M_dataplus)._M_p + uVar7 * 8 + 8) =
         *(pointer)((long)local_48 + uVar7 * 8);
    pbVar4 = (mzp->entry_data).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    memcpy((out->_M_dataplus)._M_p +
           (ulong)((pointer)((long)local_48 + uVar7 * 8))->sector_offset * 0x800 +
           (ulong)((pointer)((long)local_48 + uVar7 * 8))->byte_offset + lVar10 + 8,
           pbVar4[uVar7]._M_dataplus._M_p,pbVar4[uVar7]._M_string_length);
  }
  std::_Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ::~_Vector_base((_Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                   *)local_48);
  return;
}

Assistant:

void mzp_write(const Mzp &mzp, std::string &out) {
  // Clear output
  out.clear();

  // Write header
  Mzp::MzpArchiveHeader header;
  memcpy(header.magic, Mzp::FILE_MAGIC, sizeof(Mzp::MzpArchiveHeader::magic));
  header.archive_entry_count = mzp.entry_headers.size();
  header.to_file_order();
  out.resize(sizeof(header));
  memcpy(&out[0], &header, sizeof(header));

  // Calculate the data segment start
  std::string::size_type data_segment_start =
      sizeof(Mzp::MzpArchiveHeader) +
      sizeof(Mzp::MzpArchiveEntry) * mzp.entry_headers.size();

  // Clone the header data so that we can recalculate it
  std::vector<Mzp::MzpArchiveEntry> entry_headers = mzp.entry_headers;
  std::string::size_type current_data_offset = 0;
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    Mzp::MzpArchiveEntry &entry_header = entry_headers[i];
    auto &entry_data = mzp.entry_data[i];
    const std::string::size_type entry_size = entry_data.size();
    entry_header.set_offsets(current_data_offset);
    entry_header.set_data_size(entry_size);
    current_data_offset += entry_size;
    // Pad current data offset to 16 byte boundary
    // const std::string::size_type real_data_end_addr =
    //     data_segment_start + current_data_offset;
    // current_data_offset += 16 - (real_data_end_addr % 16);
  }

  // Calculate total file size
  const std::string::size_type output_size =
      data_segment_start + current_data_offset;
  out.resize(output_size, 0xFF);

  // Write out each datum pair, since we need to use the header to get the
  // correct data offset
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    // Convert header to file order and emit
    auto &entry_header = entry_headers[i];
    entry_header.to_file_order();
    const std::string::size_type header_output_offset =
        sizeof(Mzp::MzpArchiveHeader) + sizeof(Mzp::MzpArchiveEntry) * i;
    memcpy(&out[header_output_offset], &entry_header, sizeof(entry_header));

    // Insert data at data start + data offset
    auto &entry_data = mzp.entry_data[i];
    memcpy(&out[data_segment_start + entry_header.data_offset_relative()],
           entry_data.data(), entry_data.size());
  }
}